

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_plane(rf_vec3 center_pos,rf_vec2 size,rf_color color)

{
  _Bool _Var1;
  undefined1 local_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  undefined1 uStack_31;
  undefined4 uStack_30;
  rf_color color_local;
  rf_vec2 size_local;
  undefined4 local_18;
  undefined4 uStack_14;
  rf_vec3 center_pos_local;
  
  _Var1 = rf_gfx_check_buffer_limit(4);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_push_matrix();
  local_18 = center_pos.x;
  uStack_14 = center_pos.y;
  rf_gfx_translatef(local_18,uStack_14,center_pos.z);
  uStack_30 = size.x;
  color_local = (rf_color)size.y;
  rf_gfx_scalef(uStack_30,1.0,(float)color_local);
  rf_gfx_begin(RF_QUADS);
  local_34 = color.r;
  uStack_33 = color.g;
  uStack_32 = color.b;
  uStack_31 = color.a;
  rf_gfx_color4ub(local_34,uStack_33,uStack_32,uStack_31);
  rf_gfx_normal3f(0.0,1.0,0.0);
  rf_gfx_vertex3f(-0.5,0.0,-0.5);
  rf_gfx_vertex3f(-0.5,0.0,0.5);
  rf_gfx_vertex3f(0.5,0.0,0.5);
  rf_gfx_vertex3f(0.5,0.0,-0.5);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_plane(rf_vec3 center_pos, rf_vec2 size, rf_color color)
{
    if (rf_gfx_check_buffer_limit(4)) rf_gfx_draw();

    // NOTE: Plane is always created on XZ ground
    rf_gfx_push_matrix();
    rf_gfx_translatef(center_pos.x, center_pos.y, center_pos.z);
    rf_gfx_scalef(size.x, 1.0f, size.y);

    rf_gfx_begin(RF_QUADS);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_normal3f(0.0f, 1.0f, 0.0f);

    rf_gfx_vertex3f(-0.5f, 0.0f, -0.5f);
    rf_gfx_vertex3f(-0.5f, 0.0f, 0.5f);
    rf_gfx_vertex3f(0.5f, 0.0f, 0.5f);
    rf_gfx_vertex3f(0.5f, 0.0f, -0.5f);
    rf_gfx_end();
    rf_gfx_pop_matrix();
}